

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

bool double_conversion::(anonymous_namespace)::
     ConsumeSubStringImpl<unsigned_short_const*,char(*)(char)>
               (unsigned_short **current,unsigned_short *end,char *substring,
               _func_char_char *converter)

{
  char cVar1;
  char cVar2;
  char cVar3;
  unsigned_short *puVar4;
  char *pcVar5;
  
  pcVar5 = substring + 1;
  do {
    cVar1 = *pcVar5;
    puVar4 = *current + 1;
    *current = puVar4;
    if ((cVar1 == '\0') || (puVar4 == end)) break;
    cVar3 = (*converter)((char)*puVar4);
    cVar2 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  } while (cVar3 == cVar2);
  return cVar1 == '\0';
}

Assistant:

static inline bool ConsumeSubStringImpl(Iterator* current,
                                        Iterator end,
                                        const char* substring,
                                        Converter converter) {
  DOUBLE_CONVERSION_ASSERT(converter(**current) == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || converter(**current) != *substring) {
      return false;
    }
  }
  ++*current;
  return true;
}